

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O3

void __thiscall
bssl::gtest_suite_PkitsTest12InhibitAnyPolicy_::
Section12InvalidinhibitAnyPolicyTest5<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>::
~Section12InvalidinhibitAnyPolicyTest5
          (Section12InvalidinhibitAnyPolicyTest5<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest12InhibitAnyPolicy,
                     Section12InvalidinhibitAnyPolicyTest5) {
  const char* const certs[] = {
      "TrustAnchorRootCertificate", "inhibitAnyPolicy5CACert",
      "inhibitAnyPolicy5subCACert", "inhibitAnyPolicy5subsubCACert",
      "InvalidinhibitAnyPolicyTest5EE"};
  const char* const crls[] = {"TrustAnchorRootCRL", "inhibitAnyPolicy5CACRL",
                              "inhibitAnyPolicy5subCACRL",
                              "inhibitAnyPolicy5subsubCACRL"};
  PkitsTestInfo info;
  info.test_number = "4.12.5";
  info.should_validate = false;
  info.SetUserConstrainedPolicySet("");

  this->RunTest(certs, crls, info);
}